

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void makeItem(item *x,object *y)

{
  int iVar1;
  typeDesc *ptVar2;
  int r;
  typeDesc *type;
  object *y_local;
  item *x_local;
  
  x->mode = y->cl;
  x->typeIndex = y->typeIndex;
  x->lev = y->lev;
  x->a = y->val;
  if ((y->cl == 0x2c0) || (y->cl == 0x2c4)) {
    x->typeIndex = y->retTypeIndex;
    x->r = 0x1c;
  }
  else if (y->lev == 0) {
    x->r = 0;
  }
  else {
    if (y->lev != currentLevel) {
      mark("level");
      exit(-1);
    }
    x->r = 0x1d;
  }
  if (y->cl == 0x2c5) {
    ptVar2 = getType(y->typeIndex);
    if (ptVar2->form == 0x322) {
      iVar1 = getReg();
      put(0x20,iVar1,x->r,x->a + 4);
      x->alr = iVar1;
      iVar1 = getReg();
      put(0x20,iVar1,x->r,x->a + 8);
      x->hs = iVar1;
      iVar1 = getReg();
      put(0x20,iVar1,x->r,x->a);
      x->mode = 0x2c1;
      x->r = iVar1;
      x->a = 0;
    }
    else {
      x->mode = 0x2c1;
    }
  }
  return;
}

Assistant:

procedure 
void makeItem(struct item *x, struct object *y) {
	variable struct typeDesc *type;
	variable int r;
	r = 0; type =  NULL;
	x->mode = y->cl; x->typeIndex = y->typeIndex; x->lev = y->lev; x->a = y->val; 

	/* in case of proc or sproc, x->r is return value register */
	if ((y->cl == CLASS_PROC) || (y->cl == CLASS_SPROC)) {
		x->typeIndex = y->retTypeIndex;
		x->r = rv;
	} else {
		if (y->lev == 0) { 
			x->r = 0; 
		} elsif (y->lev == currentLevel) {
			x->r = fp;
		} else {
			mark("level");
			exit(-1);
		}
	}
	
	/* load paramater object */
	if (y->cl == CLASS_PAR) {
		type = getType(y->typeIndex);

		/* in case of array: first load length (+4) | isOnStack (+8) */
		if (type->form == FORM_ARRAY) {
			r = getReg();
			put(RISC_LDW,r,x->r,x->a + 4); 
			x->alr = r;
			r = getReg();
			put(RISC_LDW,r,x->r,x->a + 8); 
			x->hs = r;
			r = getReg();
			put(RISC_LDW,r,x->r,x->a);
			x->mode = CLASS_VAR; x->r = r; x->a = 0; 
		} else {
			x->mode = CLASS_VAR;
		}
		
	}
}